

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

void __thiscall
ON_PolylineCurve::ON_PolylineCurve
          (ON_PolylineCurve *this,ON_3dPointArray *points,ON_SimpleArray<double> *params)

{
  ulong uVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  ON_Curve::ON_Curve(&this->super_ON_Curve);
  (this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00827150;
  ON_Polyline::ON_Polyline(&this->m_pline);
  (this->m_t)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
  (this->m_t).m_a = (double *)0x0;
  (this->m_t).m_count = 0;
  (this->m_t).m_capacity = 0;
  operator=(this,points);
  uVar3 = params->m_count;
  if ((points->super_ON_SimpleArray<ON_3dPoint>).m_count == uVar3) {
    bVar7 = 1 < (int)uVar3;
    if (1 < (int)uVar3) {
      pdVar4 = params->m_a;
      if (*pdVar4 < pdVar4[1]) {
        uVar6 = 1;
        do {
          if ((2 - (ulong)uVar3) + uVar6 == 1) goto LAB_00599a16;
          pdVar2 = pdVar4 + uVar6;
          uVar1 = uVar6 + 1;
          lVar5 = uVar6 + 1;
          uVar6 = uVar1;
        } while (*pdVar2 < pdVar4[lVar5]);
        bVar7 = uVar1 < uVar3;
      }
      if (bVar7) {
        return;
      }
    }
LAB_00599a16:
    ON_SimpleArray<double>::operator=(&this->m_t,params);
  }
  return;
}

Assistant:

ON_PolylineCurve::ON_PolylineCurve(const ON_3dPointArray& points, const ON_SimpleArray<double>& params)
{
  *this = points;
  if (points.Count() == params.Count())
  {
    for (int i = 1; i < params.Count(); i++)
    {
      if (params[i-1] >= params[i])
        return;
    }
    m_t = params;
  }
}